

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixellayout.cpp
# Opt level: O0

QRgbaFloat32 *
fetchARGBToRGBA32F<(QImage::Format)8>
          (QRgbaFloat32 *buffer,uchar *src,int index,int count,QList<unsigned_int> *param_5,
          QDitherInfo *param_6)

{
  long lVar1;
  QRgbaFloat32 *pQVar2;
  int in_ECX;
  QRgbaFloat32 *in_RDI;
  long in_FS_OFFSET;
  QRgbaFloat<float> QVar3;
  int i;
  BPP bpp;
  undefined8 in_stack_ffffffffffffff68;
  uint rgb;
  int iVar4;
  undefined4 uVar5;
  float local_28;
  float fStack_24;
  float local_20;
  float fStack_1c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = 5;
  for (iVar4 = 0; iVar4 < in_ECX; iVar4 = iVar4 + 1) {
    rgb = (uint)((ulong)in_stack_ffffffffffffff68 >> 0x20);
    fetchPixel<(QPixelLayout::BPP)5>((uchar *)CONCAT44(uVar5,iVar4),rgb);
    convertPixelToARGB32PM<(QImage::Format)8>((uint)((ulong)in_RDI >> 0x20));
    QVar3 = QRgbaFloat<float>::fromArgb32(rgb);
    local_28 = QVar3.r;
    fStack_1c = QVar3.a;
    fStack_24 = QVar3.g;
    local_20 = QVar3.b;
    pQVar2 = in_RDI + iVar4;
    pQVar2->r = local_28 * fStack_1c;
    pQVar2->g = fStack_24 * fStack_1c;
    pQVar2->b = local_20 * fStack_1c;
    pQVar2->a = fStack_1c;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static const QRgbaFloat32 *QT_FASTCALL fetchARGBToRGBA32F(QRgbaFloat32 *buffer, const uchar *src, int index, int count,
                                                      const QList<QRgb> *, QDitherInfo *)
{
    constexpr QPixelLayout::BPP bpp = bitsPerPixel<Format>();
    for (int i = 0; i < count; ++i)
        buffer[i] = convertPixelToRGBA32F<Format>(fetchPixel<bpp>(src, index + i)).premultiplied();
    return buffer;
}